

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_unk74(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk74.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk74.version;
  if ((bios->power).unk74.valid != '\0') {
    fprintf((FILE *)out,"LOW POWER table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk74.offset,(uint)(bios->power).unk74.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk74.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(bios->power).unk74.entries[uVar2].offset,
                           (uint)(bios->power).unk74.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->power).unk74.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse LOW POWER table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
  return;
}

Assistant:

void envy_bios_print_power_unk74(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk74 *unk74 = &bios->power.unk74;
	int i;

	if (!unk74->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk74->valid) {
		fprintf(out, "Failed to parse LOW POWER table at 0x%x, version %x\n", unk74->offset, unk74->version);
		return;
	}

	fprintf(out, "LOW POWER table at 0x%x, version %x\n", unk74->offset, unk74->version);
	envy_bios_dump_hex(bios, out, unk74->offset, unk74->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk74->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk74->entries[i].offset, unk74->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}